

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_avx2_256_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  void *pvVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i c_03;
  __m256i c_04;
  __m256i c_05;
  uint uVar24;
  undefined4 uVar25;
  parasail_result_t *ppVar26;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *b_06;
  __m256i *__dest;
  __m256i *__dest_00;
  __m256i *__dest_01;
  __m256i *__dest_02;
  __m256i *ptr;
  __m256i *ptr_00;
  size_t __n;
  short sVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  short sVar32;
  uint uVar33;
  ulong uVar34;
  int iVar35;
  short sVar36;
  uint uVar37;
  uint uVar38;
  long lVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  short sVar43;
  undefined2 uVar44;
  undefined2 uVar45;
  undefined2 uVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 in_stack_fffffffffffffcc8 [12];
  ushort uVar52;
  undefined2 uVar53;
  __m256i *ptr_01;
  __m256i *ptr_02;
  int local_304;
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  undefined1 local_138 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_58 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_scan_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar2 = (profile->profile16).score;
    if (pvVar2 == (void *)0x0) {
      parasail_sw_stats_scan_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_scan_profile_avx2_256_16_cold_6();
      }
      else {
        uVar40 = profile->s1Len;
        uVar34 = (ulong)uVar40;
        if ((int)uVar40 < 1) {
          parasail_sw_stats_scan_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_scan_profile_avx2_256_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_stats_scan_profile_avx2_256_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_scan_profile_avx2_256_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_scan_profile_avx2_256_16_cold_1();
        }
        else {
          pvVar4 = (profile->profile16).matches;
          iVar28 = ppVar3->min;
          iVar35 = -iVar28;
          if (iVar28 != -open && SBORROW4(iVar28,-open) == iVar28 + open < 0) {
            iVar35 = open;
          }
          pvVar5 = (profile->profile16).similar;
          sVar43 = 0x7ffe - (short)ppVar3->max;
          ppVar26 = parasail_result_new_stats();
          if (ppVar26 != (parasail_result_t *)0x0) {
            uVar46 = (undefined2)iVar35;
            uVar53 = (undefined2)((uint)iVar35 >> 0x10);
            uVar42 = uVar34 + 0xf >> 4;
            ppVar26->flag = ppVar26->flag | 0x10210404;
            b = parasail_memalign___m256i(0x20,uVar42);
            b_00 = parasail_memalign___m256i(0x20,uVar42);
            b_01 = parasail_memalign___m256i(0x20,uVar42);
            b_02 = parasail_memalign___m256i(0x20,uVar42);
            b_03 = parasail_memalign___m256i(0x20,uVar42);
            b_04 = parasail_memalign___m256i(0x20,uVar42);
            b_05 = parasail_memalign___m256i(0x20,uVar42);
            b_06 = parasail_memalign___m256i(0x20,uVar42);
            __dest = parasail_memalign___m256i(0x20,uVar42);
            __dest_00 = parasail_memalign___m256i(0x20,uVar42);
            __dest_01 = parasail_memalign___m256i(0x20,uVar42);
            __dest_02 = parasail_memalign___m256i(0x20,uVar42);
            ptr = parasail_memalign___m256i(0x20,uVar42);
            ptr_00 = parasail_memalign___m256i(0x20,uVar42);
            if (b == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_00 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_01 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_02 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_03 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_04 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_05 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_06 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_00 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_01 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_02 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar44 = (undefined2)open;
            uVar45 = (undefined2)gap;
            uVar38 = CONCAT22(uVar53,uVar46) - 0x7fff;
            uVar46 = (undefined2)uVar38;
            uVar41 = (uint)uVar42;
            local_288._0_2_ = (undefined2)uVar42;
            local_288._2_2_ = local_288._0_2_;
            local_288._4_2_ = local_288._0_2_;
            local_288._6_2_ = local_288._0_2_;
            local_288._8_2_ = local_288._0_2_;
            local_288._10_2_ = local_288._0_2_;
            local_288._12_2_ = local_288._0_2_;
            local_288._14_2_ = local_288._0_2_;
            local_288._16_2_ = local_288._0_2_;
            local_288._18_2_ = local_288._0_2_;
            local_288._20_2_ = local_288._0_2_;
            local_288._22_2_ = local_288._0_2_;
            local_288._24_2_ = local_288._0_2_;
            local_288._26_2_ = local_288._0_2_;
            local_288._28_2_ = local_288._0_2_;
            local_288._30_2_ = local_288._0_2_;
            auVar22 = vperm2i128_avx2(local_288,local_288,0x28);
            uVar37 = uVar38 & 0xffff;
            auVar47._0_2_ = (undefined2)-(gap * uVar41);
            auVar47._2_2_ = auVar47._0_2_;
            auVar47._4_2_ = auVar47._0_2_;
            auVar47._6_2_ = auVar47._0_2_;
            auVar47._8_2_ = auVar47._0_2_;
            auVar47._10_2_ = auVar47._0_2_;
            auVar47._12_2_ = auVar47._0_2_;
            auVar47._14_2_ = auVar47._0_2_;
            auVar47._16_2_ = auVar47._0_2_;
            auVar47._18_2_ = auVar47._0_2_;
            auVar47._20_2_ = auVar47._0_2_;
            auVar47._22_2_ = auVar47._0_2_;
            auVar47._24_2_ = auVar47._0_2_;
            auVar47._26_2_ = auVar47._0_2_;
            auVar47._28_2_ = auVar47._0_2_;
            auVar47._30_2_ = auVar47._0_2_;
            auVar47 = vpand_avx2(auVar47,_DAT_008d4840);
            auVar47 = vpaddsw_avx2(ZEXT432(uVar37),auVar47);
            alVar1[1]._4_2_ = uVar46;
            alVar1._0_12_ = in_stack_fffffffffffffcc8;
            alVar1[1]._6_2_ = (short)(uVar38 >> 0x10);
            alVar1[2] = (longlong)b_01;
            alVar1[3] = (longlong)b_00;
            parasail_memset___m256i(b_03,alVar1,uVar42);
            c[1]._4_2_ = (short)uVar38;
            c._0_12_ = in_stack_fffffffffffffcc8;
            c[1]._6_2_ = (short)(uVar38 >> 0x10);
            c[2] = (longlong)b_01;
            c[3] = (longlong)b_00;
            parasail_memset___m256i(b_04,c,uVar42);
            c_00[1]._4_2_ = (short)uVar38;
            c_00._0_12_ = in_stack_fffffffffffffcc8;
            c_00[1]._6_2_ = (short)(uVar38 >> 0x10);
            c_00[2] = (longlong)b_01;
            c_00[3] = (longlong)b_00;
            parasail_memset___m256i(b_05,c_00,uVar42);
            c_01[1]._4_2_ = (short)uVar38;
            c_01._0_12_ = in_stack_fffffffffffffcc8;
            c_01[1]._6_2_ = (short)(uVar38 >> 0x10);
            c_01[2] = (longlong)b_01;
            c_01[3] = (longlong)b_00;
            parasail_memset___m256i(b_06,c_01,uVar42);
            c_02[1]._4_2_ = (short)uVar38;
            c_02._0_12_ = in_stack_fffffffffffffcc8;
            c_02[1]._6_2_ = (short)(uVar38 >> 0x10);
            c_02[2] = (longlong)b_01;
            c_02[3] = (longlong)b_00;
            parasail_memset___m256i(b,c_02,uVar42);
            c_03[1]._4_2_ = (short)uVar38;
            c_03._0_12_ = in_stack_fffffffffffffcc8;
            c_03[1]._6_2_ = (short)(uVar38 >> 0x10);
            c_03[2] = (longlong)b_01;
            c_03[3] = (longlong)b_00;
            parasail_memset___m256i(b_00,c_03,uVar42);
            c_04[1]._4_2_ = (short)uVar38;
            c_04._0_12_ = in_stack_fffffffffffffcc8;
            c_04[1]._6_2_ = (short)(uVar38 >> 0x10);
            c_04[2] = (longlong)b_01;
            c_04[3] = (longlong)b_00;
            parasail_memset___m256i(b_01,c_04,uVar42);
            c_05[1]._4_2_ = (short)uVar38;
            c_05._0_12_ = in_stack_fffffffffffffcc8;
            c_05[1]._6_2_ = (short)(uVar38 >> 0x10);
            c_05[2] = (longlong)b_01;
            c_05[3] = (longlong)b_00;
            parasail_memset___m256i(b_02,c_05,uVar42);
            auVar23._2_2_ = uVar45;
            auVar23._0_2_ = uVar45;
            auVar23._4_2_ = uVar45;
            auVar23._6_2_ = uVar45;
            auVar23._8_2_ = uVar45;
            auVar23._10_2_ = uVar45;
            auVar23._12_2_ = uVar45;
            auVar23._14_2_ = uVar45;
            auVar23._16_2_ = uVar45;
            auVar23._18_2_ = uVar45;
            auVar23._20_2_ = uVar45;
            auVar23._22_2_ = uVar45;
            auVar23._24_2_ = uVar45;
            auVar23._26_2_ = uVar45;
            auVar23._28_2_ = uVar45;
            auVar23._30_2_ = uVar45;
            auVar6._2_2_ = uVar44;
            auVar6._0_2_ = uVar44;
            auVar6._4_2_ = uVar44;
            auVar6._6_2_ = uVar44;
            auVar6._8_2_ = uVar44;
            auVar6._10_2_ = uVar44;
            auVar6._12_2_ = uVar44;
            auVar6._14_2_ = uVar44;
            auVar6._16_2_ = uVar44;
            auVar6._18_2_ = uVar44;
            auVar6._20_2_ = uVar44;
            auVar6._22_2_ = uVar44;
            auVar6._24_2_ = uVar44;
            auVar6._26_2_ = uVar44;
            auVar6._28_2_ = uVar44;
            auVar6._30_2_ = uVar44;
            uVar24 = uVar41 - 1;
            auVar20 = vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar6);
            lVar29 = (ulong)uVar24 << 5;
            auVar48._8_2_ = 1;
            auVar48._0_8_ = 0x1000100010001;
            auVar48._10_2_ = 1;
            auVar48._12_2_ = 1;
            auVar48._14_2_ = 1;
            auVar48._16_2_ = 1;
            auVar48._18_2_ = 1;
            auVar48._20_2_ = 1;
            auVar48._22_2_ = 1;
            auVar48._24_2_ = 1;
            auVar48._26_2_ = 1;
            auVar48._28_2_ = 1;
            auVar48._30_2_ = 1;
            uVar31 = uVar42;
            auVar6 = auVar48;
            do {
              *(undefined1 (*) [32])((long)*ptr + lVar29) = auVar20;
              *(undefined1 (*) [32])((long)*ptr_00 + lVar29) = auVar6;
              auVar20 = vpsubsw_avx2(auVar20,auVar23);
              auVar6 = vpaddsw_avx2(auVar6,auVar48);
              lVar29 = lVar29 + -0x20;
              iVar28 = (int)uVar31;
              uVar33 = iVar28 - 1;
              uVar31 = (ulong)uVar33;
            } while (uVar33 != 0 && 0 < iVar28);
            __n = uVar42 << 5;
            uVar42 = 1;
            if (1 < s2Len) {
              uVar42 = (ulong)(uint)s2Len;
            }
            auVar6 = vpalignr_avx2(local_288,auVar22,0xe);
            lVar29 = (ulong)(uVar41 + (uVar41 == 0)) << 5;
            uVar31 = 0;
            local_304 = 0;
            local_f8._2_2_ = uVar46;
            local_f8._0_2_ = uVar46;
            local_f8._4_2_ = uVar46;
            local_f8._6_2_ = uVar46;
            local_f8._8_2_ = uVar46;
            local_f8._10_2_ = uVar46;
            local_f8._12_2_ = uVar46;
            local_f8._14_2_ = uVar46;
            local_f8._16_2_ = uVar46;
            local_f8._18_2_ = uVar46;
            local_f8._20_2_ = uVar46;
            local_f8._22_2_ = uVar46;
            local_f8._24_2_ = uVar46;
            local_f8._26_2_ = uVar46;
            local_f8._28_2_ = uVar46;
            local_f8._30_2_ = uVar46;
            auVar19._2_2_ = sVar43;
            auVar19._0_2_ = sVar43;
            auVar19._4_2_ = sVar43;
            auVar19._6_2_ = sVar43;
            auVar19._8_2_ = sVar43;
            auVar19._10_2_ = sVar43;
            auVar19._12_2_ = sVar43;
            auVar19._14_2_ = sVar43;
            auVar19._16_2_ = sVar43;
            auVar19._18_2_ = sVar43;
            auVar19._20_2_ = sVar43;
            auVar19._22_2_ = sVar43;
            auVar19._24_2_ = sVar43;
            auVar19._26_2_ = sVar43;
            auVar19._28_2_ = sVar43;
            auVar19._30_2_ = sVar43;
            ptr_01 = b_01;
            ptr_02 = b_00;
            auVar22 = local_f8;
            auVar20 = local_f8;
            do {
              lVar30 = (long)(int)(ppVar3->mapper[(byte)s2[uVar31]] * uVar41) * 0x20;
              alVar1 = b_06[uVar24];
              auVar23 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar13 = vpalignr_avx2((undefined1  [32])alVar1,auVar23,0xe);
              alVar1 = b_05[uVar24];
              auVar23 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar49 = vpalignr_avx2((undefined1  [32])alVar1,auVar23,0xe);
              alVar1 = b_04[uVar24];
              auVar23 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar48 = vpalignr_avx2((undefined1  [32])alVar1,auVar23,0xe);
              alVar1 = b_03[uVar24];
              auVar23 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar23 = vpalignr_avx2((undefined1  [32])alVar1,auVar23,0xe);
              lVar39 = 0;
              local_2a8 = ZEXT1632(ZEXT816(0));
              local_138 = ZEXT1632(ZEXT816(0));
              auVar50 = ZEXT1664((undefined1  [16])0x0);
              auVar18._2_2_ = uVar46;
              auVar18._0_2_ = uVar46;
              auVar18._4_2_ = uVar46;
              auVar18._6_2_ = uVar46;
              auVar18._8_2_ = uVar46;
              auVar18._10_2_ = uVar46;
              auVar18._12_2_ = uVar46;
              auVar18._14_2_ = uVar46;
              auVar18._16_2_ = uVar46;
              auVar18._18_2_ = uVar46;
              auVar18._20_2_ = uVar46;
              auVar18._22_2_ = uVar46;
              auVar18._24_2_ = uVar46;
              auVar18._26_2_ = uVar46;
              auVar18._28_2_ = uVar46;
              auVar18._30_2_ = uVar46;
              auVar51 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar7 = vpaddsw_avx2(auVar23,*(undefined1 (*) [32])((long)pvVar2 + lVar39 + lVar30)
                                     );
                auVar8 = vpaddsw_avx2(auVar48,*(undefined1 (*) [32])((long)pvVar4 + lVar39 + lVar30)
                                     );
                auVar23 = *(undefined1 (*) [32])((long)*b_03 + lVar39);
                auVar48 = *(undefined1 (*) [32])((long)*b_04 + lVar39);
                auVar9 = vpaddsw_avx2(auVar49,*(undefined1 (*) [32])((long)pvVar5 + lVar39 + lVar30)
                                     );
                auVar49 = *(undefined1 (*) [32])((long)*b_05 + lVar39);
                auVar10 = vpaddsw_avx2(auVar51._0_32_,*(undefined1 (*) [32])((long)*ptr + lVar39));
                auVar11._8_2_ = 1;
                auVar11._0_8_ = 0x1000100010001;
                auVar11._10_2_ = 1;
                auVar11._12_2_ = 1;
                auVar11._14_2_ = 1;
                auVar11._16_2_ = 1;
                auVar11._18_2_ = 1;
                auVar11._20_2_ = 1;
                auVar11._22_2_ = 1;
                auVar11._24_2_ = 1;
                auVar11._26_2_ = 1;
                auVar11._28_2_ = 1;
                auVar11._30_2_ = 1;
                auVar11 = vpaddsw_avx2(auVar13,auVar11);
                auVar13 = *(undefined1 (*) [32])((long)*b_06 + lVar39);
                auVar15 = vpcmpgtw_avx2(auVar10,auVar18);
                auVar14 = vpblendvb_avx2(auVar50._0_32_,local_58,auVar15);
                auVar50 = ZEXT3264(auVar14);
                local_138 = vpblendvb_avx2(local_138,local_288,auVar15);
                auVar12 = vpaddsw_avx2(local_d8,*(undefined1 (*) [32])((long)*ptr_00 + lVar39));
                local_2a8 = vpblendvb_avx2(local_2a8,auVar12,auVar15);
                auVar15._2_2_ = uVar44;
                auVar15._0_2_ = uVar44;
                auVar15._4_2_ = uVar44;
                auVar15._6_2_ = uVar44;
                auVar15._8_2_ = uVar44;
                auVar15._10_2_ = uVar44;
                auVar15._12_2_ = uVar44;
                auVar15._14_2_ = uVar44;
                auVar15._16_2_ = uVar44;
                auVar15._18_2_ = uVar44;
                auVar15._20_2_ = uVar44;
                auVar15._22_2_ = uVar44;
                auVar15._24_2_ = uVar44;
                auVar15._26_2_ = uVar44;
                auVar15._28_2_ = uVar44;
                auVar15._30_2_ = uVar44;
                auVar15 = vpsubsw_avx2(auVar23,auVar15);
                auVar12._2_2_ = uVar45;
                auVar12._0_2_ = uVar45;
                auVar12._4_2_ = uVar45;
                auVar12._6_2_ = uVar45;
                auVar12._8_2_ = uVar45;
                auVar12._10_2_ = uVar45;
                auVar12._12_2_ = uVar45;
                auVar12._14_2_ = uVar45;
                auVar12._16_2_ = uVar45;
                auVar12._18_2_ = uVar45;
                auVar12._20_2_ = uVar45;
                auVar12._22_2_ = uVar45;
                auVar12._24_2_ = uVar45;
                auVar12._26_2_ = uVar45;
                auVar12._28_2_ = uVar45;
                auVar12._30_2_ = uVar45;
                auVar21 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*b + lVar39),auVar12);
                auVar12 = vpcmpgtw_avx2(auVar15,auVar21);
                auVar17 = vpmaxsw_avx2(auVar15,auVar21);
                auVar15 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + lVar39),auVar48,
                                         auVar12);
                auVar21 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + lVar39),auVar49,
                                         auVar12);
                auVar12 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + lVar39),auVar13,
                                         auVar12);
                auVar16._8_2_ = 1;
                auVar16._0_8_ = 0x1000100010001;
                auVar16._10_2_ = 1;
                auVar16._12_2_ = 1;
                auVar16._14_2_ = 1;
                auVar16._16_2_ = 1;
                auVar16._18_2_ = 1;
                auVar16._20_2_ = 1;
                auVar16._22_2_ = 1;
                auVar16._24_2_ = 1;
                auVar16._26_2_ = 1;
                auVar16._28_2_ = 1;
                auVar16._30_2_ = 1;
                auVar12 = vpaddsw_avx2(auVar12,auVar16);
                auVar16 = vpcmpgtw_avx2(auVar17,auVar7);
                *(undefined1 (*) [32])((long)*b + lVar39) = auVar17;
                *(undefined1 (*) [32])((long)*b_00 + lVar39) = auVar15;
                local_58 = vpblendvb_avx2(auVar8,auVar15,auVar16);
                *(undefined1 (*) [32])((long)*b_01 + lVar39) = auVar21;
                local_288 = vpblendvb_avx2(auVar9,auVar21,auVar16);
                local_d8 = vpblendvb_avx2(auVar11,auVar12,auVar16);
                *(undefined1 (*) [32])((long)*b_02 + lVar39) = auVar12;
                auVar18 = vpmaxsw_avx2(auVar18,auVar10);
                auVar10 = vpmaxsw_avx2(auVar17,auVar7);
                auVar51 = ZEXT3264(auVar10);
                *(undefined1 (*) [32])((long)*b_03 + lVar39) = auVar7;
                *(undefined1 (*) [32])((long)*b_04 + lVar39) = auVar8;
                *(undefined1 (*) [32])((long)*b_05 + lVar39) = auVar9;
                *(undefined1 (*) [32])((long)*b_06 + lVar39) = auVar11;
                lVar39 = lVar39 + 0x20;
              } while (lVar29 != lVar39);
              auVar23 = vperm2i128_avx2(local_58,local_58,0x28);
              local_58 = vpalignr_avx2(local_58,auVar23,0xe);
              auVar23 = vperm2i128_avx2(local_288,local_288,0x28);
              local_288 = vpalignr_avx2(local_288,auVar23,0xe);
              auVar48 = vperm2i128_avx2(local_d8,local_d8,0x28);
              auVar23 = vperm2i128_avx2(auVar10,auVar10,0x28);
              auVar49 = vpalignr_avx2(auVar10,auVar23,0xe);
              auVar23 = vpaddsw_avx2(auVar49,(undefined1  [32])*ptr);
              local_d8 = vpalignr_avx2(local_d8,auVar48,0xe);
              auVar8 = vpcmpgtw_avx2(auVar18,auVar23);
              auVar7 = vpblendvb_avx2(local_58,auVar14,auVar8);
              auVar13 = vpblendvb_avx2(local_288,local_138,auVar8);
              auVar48 = vpaddsw_avx2(local_d8,(undefined1  [32])*ptr_00);
              auVar18 = vpmaxsw_avx2(auVar18,auVar23);
              auVar23 = vpblendvb_avx2(auVar48,local_2a8,auVar8);
              iVar28 = 0xe;
              do {
                auVar9 = vperm2i128_avx2(auVar23,auVar23,0x28);
                auVar10 = vperm2i128_avx2(auVar13,auVar13,0x28);
                auVar11 = vperm2i128_avx2(auVar7,auVar7,0x28);
                auVar48 = vperm2i128_avx2(auVar18,auVar18,0x28);
                auVar48 = vpalignr_avx2(auVar18,auVar48,0xe);
                auVar48 = vpaddsw_avx2(auVar48,auVar47);
                auVar8 = vpcmpgtw_avx2(auVar18,auVar48);
                auVar18 = vpmaxsw_avx2(auVar48,auVar18);
                auVar48 = vpalignr_avx2(auVar7,auVar11,0xe);
                auVar7 = vpblendvb_avx2(auVar48,auVar7,auVar8);
                auVar48 = vpalignr_avx2(auVar13,auVar10,0xe);
                auVar13 = vpblendvb_avx2(auVar48,auVar13,auVar8);
                auVar48 = vpalignr_avx2(auVar23,auVar9,0xe);
                auVar48 = vpaddsw_avx2(auVar6,auVar48);
                auVar23 = vpblendvb_avx2(auVar48,auVar23,auVar8);
                iVar28 = iVar28 + -1;
              } while (iVar28 != 0);
              auVar48 = vperm2i128_avx2(auVar23,auVar23,0x28);
              auVar48 = vpalignr_avx2(auVar23,auVar48,0xe);
              auVar23 = vperm2i128_avx2(auVar13,auVar13,0x28);
              auVar13 = vpalignr_avx2(auVar13,auVar23,0xe);
              auVar23 = vperm2i128_avx2(auVar7,auVar7,0x28);
              auVar7 = vpalignr_avx2(auVar7,auVar23,0xe);
              auVar23 = vperm2i128_avx2(auVar18,auVar18,0x28);
              auVar23 = vpalignr_avx2(auVar18,auVar23,0xe);
              auVar23 = vpaddsw_avx2(auVar23,ZEXT432(uVar37));
              auVar18 = vpcmpgtw_avx2(auVar23,auVar49);
              auVar9 = vpblendvb_avx2(local_d8,auVar48,auVar18);
              auVar8 = vpblendvb_avx2(local_288,auVar13,auVar18);
              auVar18 = vpblendvb_avx2(local_58,auVar7,auVar18);
              auVar49 = vpmaxsw_avx2(auVar23,auVar49);
              lVar30 = 0;
              auVar14._2_2_ = uVar44;
              auVar14._0_2_ = uVar44;
              auVar14._4_2_ = uVar44;
              auVar14._6_2_ = uVar44;
              auVar14._8_2_ = uVar44;
              auVar14._10_2_ = uVar44;
              auVar14._12_2_ = uVar44;
              auVar14._14_2_ = uVar44;
              auVar14._16_2_ = uVar44;
              auVar14._18_2_ = uVar44;
              auVar14._20_2_ = uVar44;
              auVar14._22_2_ = uVar44;
              auVar14._24_2_ = uVar44;
              auVar14._26_2_ = uVar44;
              auVar14._28_2_ = uVar44;
              auVar14._30_2_ = uVar44;
              auVar10._2_2_ = uVar45;
              auVar10._0_2_ = uVar45;
              auVar10._4_2_ = uVar45;
              auVar10._6_2_ = uVar45;
              auVar10._8_2_ = uVar45;
              auVar10._10_2_ = uVar45;
              auVar10._12_2_ = uVar45;
              auVar10._14_2_ = uVar45;
              auVar10._16_2_ = uVar45;
              auVar10._18_2_ = uVar45;
              auVar10._20_2_ = uVar45;
              auVar10._22_2_ = uVar45;
              auVar10._24_2_ = uVar45;
              auVar10._26_2_ = uVar45;
              auVar10._28_2_ = uVar45;
              auVar10._30_2_ = uVar45;
              do {
                auVar11 = *(undefined1 (*) [32])((long)*b_03 + lVar30);
                auVar49 = vpsubsw_avx2(auVar49,auVar14);
                auVar12 = vpsubsw_avx2(auVar23,auVar10);
                auVar23 = vpmaxsw_avx2(auVar12,auVar49);
                auVar49 = vpcmpgtw_avx2(auVar49,auVar12);
                auVar7 = vpblendvb_avx2(auVar7,auVar18,auVar49);
                auVar13 = vpblendvb_avx2(auVar13,auVar8,auVar49);
                auVar48 = vpblendvb_avx2(auVar48,auVar9,auVar49);
                auVar21._8_2_ = 1;
                auVar21._0_8_ = 0x1000100010001;
                auVar21._10_2_ = 1;
                auVar21._12_2_ = 1;
                auVar21._14_2_ = 1;
                auVar21._16_2_ = 1;
                auVar21._18_2_ = 1;
                auVar21._20_2_ = 1;
                auVar21._22_2_ = 1;
                auVar21._24_2_ = 1;
                auVar21._26_2_ = 1;
                auVar21._28_2_ = 1;
                auVar21._30_2_ = 1;
                auVar48 = vpaddsw_avx2(auVar21,auVar48);
                auVar49 = vpmaxsw_avx2(auVar11,*(undefined1 (*) [32])((long)*b + lVar30));
                auVar12 = vpmaxsw_avx2(auVar49,auVar23);
                auVar49 = vpmaxsw_avx2(auVar12,_DAT_008d4700);
                auVar9 = vpcmpeqw_avx2(auVar49,auVar23);
                auVar18 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + lVar30),auVar7,auVar9)
                ;
                auVar8 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + lVar30),auVar13,auVar9)
                ;
                auVar9 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + lVar30),auVar48,auVar9)
                ;
                auVar11 = vpcmpeqw_avx2(auVar11,auVar49);
                auVar18 = vpblendvb_avx2(auVar18,*(undefined1 (*) [32])((long)*b_04 + lVar30),
                                         auVar11);
                auVar8 = vpblendvb_avx2(auVar8,*(undefined1 (*) [32])((long)*b_05 + lVar30),auVar11)
                ;
                auVar9 = vpblendvb_avx2(auVar9,*(undefined1 (*) [32])((long)*b_06 + lVar30),auVar11)
                ;
                auVar11 = vpcmpgtw_avx2(auVar21,auVar12);
                auVar18 = vpandn_avx2(auVar11,auVar18);
                auVar8 = vpandn_avx2(auVar11,auVar8);
                auVar9 = vpandn_avx2(auVar11,auVar9);
                auVar20 = vpmaxsw_avx2(auVar20,auVar49);
                auVar20 = vpmaxsw_avx2(auVar20,auVar18);
                auVar11 = vpmaxsw_avx2(auVar8,auVar9);
                auVar20 = vpmaxsw_avx2(auVar20,auVar11);
                *(undefined1 (*) [32])((long)*b_03 + lVar30) = auVar49;
                *(undefined1 (*) [32])((long)*b_04 + lVar30) = auVar18;
                *(undefined1 (*) [32])((long)*b_05 + lVar30) = auVar8;
                *(undefined1 (*) [32])((long)*b_06 + lVar30) = auVar9;
                auVar19 = vpminsw_avx2(auVar19,auVar49);
                auVar22 = vpmaxsw_avx2(auVar22,auVar49);
                lVar30 = lVar30 + 0x20;
              } while (lVar29 != lVar30);
              auVar23 = vpcmpgtw_avx2(auVar22,local_f8);
              if ((((((((((((((((((((((((((((((((auVar23 >> 7 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar23 >> 0xf & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar23 >> 0x17 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar23 >> 0x1f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar23 >> 0x27 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar23 >> 0x2f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar23 >> 0x37 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar23 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar23 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar23 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar23 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar23 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar23 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar23 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar23 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar23 >> 0x7f,0) != '\0') ||
                                (auVar23 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar23 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar23 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar23 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar23 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar23 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar23 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar23 >> 0xbf,0) != '\0') ||
                        (auVar23 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar23 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar23 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar23 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar23 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar23 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar23 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  auVar23[0x1f] < '\0') {
                auVar23 = vpermq_avx2(auVar22,0x44);
                auVar23 = vpmaxsw_avx2(auVar22,auVar23);
                auVar48 = vpslldq_avx2(auVar23,8);
                auVar23 = vpmaxsw_avx2(auVar23,auVar48);
                auVar48 = vpslldq_avx2(auVar23,4);
                auVar23 = vpmaxsw_avx2(auVar23,auVar48);
                auVar48 = vpslldq_avx2(auVar23,2);
                auVar23 = vpmaxsw_avx2(auVar23,auVar48);
                uVar25 = vpextrw_avx(auVar23._16_16_,7);
                uVar52 = (ushort)uVar25;
                auVar23 = vpshufhw_avx2(auVar23,0xff);
                auVar49._8_4_ = 6;
                auVar49._0_8_ = 0x600000006;
                auVar49._12_4_ = 6;
                auVar49._16_4_ = 6;
                auVar49._20_4_ = 6;
                auVar49._24_4_ = 6;
                auVar49._28_4_ = 6;
                local_f8 = vpermd_avx2(auVar49,auVar23);
                memcpy(__dest,b_03,__n);
                memcpy(__dest_00,b_04,__n);
                memcpy(__dest_01,b_05,__n);
                b_01 = ptr_01;
                b_00 = ptr_02;
                memcpy(__dest_02,b_06,__n);
                uVar38 = (uint)uVar52;
                local_304 = (int)uVar31;
                ptr_01 = b_01;
                ptr_02 = b_00;
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar42);
            if ((uVar34 + 0xf & 0x7ffffff0) == 0) {
              sVar27 = 0;
              sVar36 = 0;
              sVar32 = 0;
            }
            else {
              uVar42 = 0;
              sVar32 = 0;
              sVar36 = 0;
              sVar27 = 0;
              do {
                if ((*(short *)((long)*__dest + uVar42 * 2) == (short)uVar38) &&
                   (uVar40 = ((uint)uVar42 & 0xf) * uVar41 + ((uint)(uVar42 >> 4) & 0xfffffff),
                   (int)uVar40 < (int)uVar34)) {
                  sVar27 = *(short *)((long)*__dest_00 + uVar42 * 2);
                  sVar36 = *(short *)((long)*__dest_01 + uVar42 * 2);
                  sVar32 = *(short *)((long)*__dest_02 + uVar42 * 2);
                  uVar34 = (ulong)uVar40;
                }
                uVar40 = (uint)uVar34;
                uVar42 = uVar42 + 1;
              } while ((uVar41 & 0x7ffffff) << 4 != (int)uVar42);
            }
            auVar22._2_2_ = uVar46;
            auVar22._0_2_ = uVar46;
            auVar22._4_2_ = uVar46;
            auVar22._6_2_ = uVar46;
            auVar22._8_2_ = uVar46;
            auVar22._10_2_ = uVar46;
            auVar22._12_2_ = uVar46;
            auVar22._14_2_ = uVar46;
            auVar22._16_2_ = uVar46;
            auVar22._18_2_ = uVar46;
            auVar22._20_2_ = uVar46;
            auVar22._22_2_ = uVar46;
            auVar22._24_2_ = uVar46;
            auVar22._26_2_ = uVar46;
            auVar22._28_2_ = uVar46;
            auVar22._30_2_ = uVar46;
            auVar47 = vpcmpgtw_avx2(auVar22,auVar19);
            auVar13._2_2_ = sVar43;
            auVar13._0_2_ = sVar43;
            auVar13._4_2_ = sVar43;
            auVar13._6_2_ = sVar43;
            auVar13._8_2_ = sVar43;
            auVar13._10_2_ = sVar43;
            auVar13._12_2_ = sVar43;
            auVar13._14_2_ = sVar43;
            auVar13._16_2_ = sVar43;
            auVar13._18_2_ = sVar43;
            auVar13._20_2_ = sVar43;
            auVar13._22_2_ = sVar43;
            auVar13._24_2_ = sVar43;
            auVar13._26_2_ = sVar43;
            auVar13._28_2_ = sVar43;
            auVar13._30_2_ = sVar43;
            auVar6 = vpcmpgtw_avx2(auVar20,auVar13);
            auVar47 = vpor_avx2(auVar6,auVar47);
            if ((((((((((((((((((((((((((((((((auVar47 >> 7 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar47 >> 0xf & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar47 >> 0x17 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar47 >> 0x1f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar47 >> 0x27 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar47 >> 0x2f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar47 >> 0x37 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar47 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar47 >> 0x47 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar47 >> 0x4f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar47 >> 0x57 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar47 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar47 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar47 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar47 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar47 >> 0x7f,0) != '\0') ||
                              (auVar47 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar47 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar47 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar47 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar47 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar47 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar47 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar47 >> 0xbf,0) != '\0') ||
                      (auVar47 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar47 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar47 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar47 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar47 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar47 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar47 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                auVar47[0x1f] < '\0') {
              *(byte *)&ppVar26->flag = (byte)ppVar26->flag | 0x40;
              uVar38 = 0;
              sVar27 = 0;
              sVar36 = 0;
              sVar32 = 0;
              local_304 = 0;
              uVar40 = 0;
            }
            ppVar26->score = (int)(short)uVar38;
            ppVar26->end_query = uVar40;
            ppVar26->end_ref = local_304;
            *(int *)(ppVar26->field_4).extra = (int)sVar27;
            ((ppVar26->field_4).stats)->similar = (int)sVar36;
            ((ppVar26->field_4).stats)->length = (int)sVar32;
            parasail_free(ptr_00);
            parasail_free(ptr);
            parasail_free(__dest_02);
            parasail_free(__dest_01);
            parasail_free(__dest_00);
            parasail_free(__dest);
            parasail_free(b_06);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(ptr_01);
            parasail_free(ptr_02);
            parasail_free(b);
            return ppVar26;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m256i*)profile->profile16.score;
    pvPm = (__m256i*)profile->profile16.matches;
    pvPs = (__m256i*)profile->profile16.similar;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi16(segLen), 2);
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            vGapperL = _mm256_adds_epi16(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i case0;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHpM = _mm256_slli_si256_rpl(vHpM, 2);
        vHpS = _mm256_slli_si256_rpl(vHpS, 2);
        vHpL = _mm256_slli_si256_rpl(vHpL, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi16(vH, vGapO);
            vE_ext = _mm256_subs_epi16(vE, vGapE);
            case1 = _mm256_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm256_max_epi16(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi16(vEL, vOne);
            vGapper = _mm256_adds_epi16(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vF, vGapper),
                    _mm256_cmpeq_epi16(vF, vGapper));
            vF = _mm256_max_epi16(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi16(vHp, vW);
            vHpM = _mm256_adds_epi16(vHpM, vWM);
            vHpS = _mm256_adds_epi16(vHpS, vWS);
            vHpL = _mm256_adds_epi16(vHpL, vOne);
            case1 = _mm256_cmpgt_epi16(vE, vHp);
            vHt = _mm256_max_epi16(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHtM = _mm256_slli_si256_rpl(vHtM, 2);
        vHtS = _mm256_slli_si256_rpl(vHtS, 2);
        vHtL = _mm256_slli_si256_rpl(vHtL, 2);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi16(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi16(vGapper, vF),
                _mm256_cmpeq_epi16(vGapper, vF));
        vF = _mm256_max_epi16(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 2);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 2);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vFt, vF),
                    _mm256_cmpeq_epi16(vFt, vF));
            vF = _mm256_max_epi16(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vFM = _mm256_slli_si256_rpl(vFM, 2);
        vFS = _mm256_slli_si256_rpl(vFS, 2);
        vFL = _mm256_slli_si256_rpl(vFL, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi16(vF, vHt);
        vH = _mm256_max_epi16(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi16(vH, vGapO);
            vF_ext = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi16(vFL, vOne);
            vH = _mm256_max_epi16(vHp, vE);
            vH = _mm256_max_epi16(vH, vF);
            vH = _mm256_max_epi16(vH, vZero);
            case1 = _mm256_cmpeq_epi16(vH, vHp);
            case2 = _mm256_cmpeq_epi16(vH, vF);
            case0 = _mm256_cmpeq_epi16(vH, vZero);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm256_blendv_epi8(vHM, vZero, case0);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm256_blendv_epi8(vHS, vZero, case0);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm256_blendv_epi8(vHL, vZero, case0);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m256i cond_max = _mm256_cmpgt_epi16(vH, vMaxH);
                vMaxH = _mm256_max_epi16(vH, vMaxH);
                vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m256i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m256i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            __m256i vHM = _mm256_load_si256(pvHM + offset);
            __m256i vHS = _mm256_load_si256(pvHS + offset);
            __m256i vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
                vHM = _mm256_slli_si256_rpl(vHM, 2);
                vHS = _mm256_slli_si256_rpl(vHS, 2);
                vHL = _mm256_slli_si256_rpl(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
            result->stats->rowcols->length_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int16_t *m = (int16_t*)pvHMMax;
        int16_t *s = (int16_t*)pvHSMax;
        int16_t *l = (int16_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}